

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanUploadHeap.cpp
# Opt level: O2

void __thiscall Diligent::VulkanUploadHeap::~VulkanUploadHeap(VulkanUploadHeap *this)

{
  char (*in_R8) [29];
  string msg;
  char *local_50;
  VkDeviceSize PeakAllocatedPages;
  ulong local_40;
  char local_38 [8];
  undefined8 local_30;
  VkDeviceSize local_28;
  char local_20 [8];
  ulong local_18;
  
  if ((this->m_Pages).
      super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_Pages).
      super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[14],std::__cxx11::string,char[29]>
              (&msg,(Diligent *)"Upload heap \'",(char (*) [14])&this->m_HeapName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\' not all pages are released",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~VulkanUploadHeap",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUploadHeap.cpp"
               ,0x30);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_40 = this->m_PeakAllocatedSize;
  PeakAllocatedPages = local_40 / this->m_PageSize;
  local_28 = this->m_PeakFrameSize;
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_30 = 0;
  local_50 = " pages)";
  if (PeakAllocatedPages == 1) {
    local_50 = " page)";
  }
  local_20._0_4_ = local_38._0_4_;
  local_18 = local_40;
  FormatString<std::__cxx11::string,char[34],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            (&msg,(Diligent *)&this->m_HeapName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " peak used/allocated frame size: ",(char (*) [34])&local_28,
             (MemorySizeFormatter<unsigned_long> *)" / ",(char (*) [4])&local_40,
             (MemorySizeFormatter<unsigned_long> *)0x5bee10,(char (*) [3])&PeakAllocatedPages,
             (unsigned_long *)&local_50,(char **)0x2);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&msg);
  std::
  vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ::~vector(&this->m_Pages);
  std::__cxx11::string::~string((string *)&this->m_HeapName);
  return;
}

Assistant:

VulkanUploadHeap::~VulkanUploadHeap()
{
    DEV_CHECK_ERR(m_Pages.empty(), "Upload heap '", m_HeapName, "' not all pages are released");
    auto PeakAllocatedPages = m_PeakAllocatedSize / m_PageSize;
    LOG_INFO_MESSAGE(m_HeapName, " peak used/allocated frame size: ", FormatMemorySize(m_PeakFrameSize, 2, m_PeakAllocatedSize),
                     " / ", FormatMemorySize(m_PeakAllocatedSize, 2),
                     " (", PeakAllocatedPages, (PeakAllocatedPages == 1 ? " page)" : " pages)"));
}